

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O0

void Wlc_BlastLut(Gia_Man_t *pNew,word Truth,int *pFans,int nFans,int nOuts,Vec_Int_t *vRes)

{
  int Entry;
  undefined1 local_48 [4];
  int iLit;
  Vec_Int_t vLeaves;
  Vec_Int_t *vMemory;
  Vec_Int_t *vRes_local;
  int nOuts_local;
  int nFans_local;
  int *pFans_local;
  word Truth_local;
  Gia_Man_t *pNew_local;
  
  pFans_local = (int *)Truth;
  Truth_local = (word)pNew;
  vLeaves.pArray = &Vec_IntAlloc(0)->nCap;
  local_48 = (undefined1  [4])nFans;
  iLit = nFans;
  vLeaves._0_8_ = pFans;
  Vec_IntClear(vRes);
  if (nOuts == 1) {
    if (nFans < 6) {
      pFans_local = (int *)Abc_Tt6Stretch((word)pFans_local,nFans);
    }
    Entry = Kit_TruthToGia((Gia_Man_t *)Truth_local,(uint *)&pFans_local,nFans,
                           (Vec_Int_t *)vLeaves.pArray,(Vec_Int_t *)local_48,1);
    Vec_IntPush(vRes,Entry);
    Vec_IntFree((Vec_Int_t *)vLeaves.pArray);
    return;
  }
  __assert_fail("nOuts == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcBlast.c"
                ,0x2d8,"void Wlc_BlastLut(Gia_Man_t *, word, int *, int, int, Vec_Int_t *)");
}

Assistant:

void Wlc_BlastLut( Gia_Man_t * pNew, word Truth, int * pFans, int nFans, int nOuts, Vec_Int_t * vRes )
{
    extern int Kit_TruthToGia( Gia_Man_t * pMan, unsigned * pTruth, int nVars, Vec_Int_t * vMemory, Vec_Int_t * vLeaves, int fHash );
    Vec_Int_t * vMemory = Vec_IntAlloc( 0 );
    Vec_Int_t vLeaves = { nFans, nFans, pFans };
    int iLit;
    Vec_IntClear( vRes );
    assert( nOuts == 1 );
    if ( nFans < 6 )
        Truth = Abc_Tt6Stretch( Truth, nFans );
    iLit = Kit_TruthToGia( pNew, (unsigned *)&Truth, nFans, vMemory, &vLeaves, 1 );
    Vec_IntPush( vRes, iLit );
    Vec_IntFree( vMemory );
}